

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::run(QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
      *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  QueueTesterFlags QVar1;
  ostream *poVar2;
  size_t in_stack_000008e0;
  EasyRandom *in_stack_000008e8;
  QueueTesterFlags in_stack_000008f4;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *in_stack_000008f8;
  ScopedLeakCheck local_a8;
  ScopedLeakCheck objecty_leak_check;
  density_tests local_80 [48];
  density_tests local_50 [39];
  byte local_29;
  size_t sStack_28;
  bool with_exceptions;
  size_t i_target_put_count_local;
  EasyRandom *i_random_local;
  QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  *pQStack_10;
  QueueTesterFlags i_flags_local;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *this_local;
  
  sStack_28 = i_target_put_count;
  i_target_put_count_local = (size_t)i_random;
  i_random_local._4_4_ = i_flags;
  pQStack_10 = this;
  QVar1 = operator&(i_flags,eTestExceptions);
  local_29 = QVar1 != eNone;
  poVar2 = std::operator<<(*(ostream **)this,"starting queue generic test with ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(this + 0xa0));
  std::operator<<(poVar2," threads and ");
  poVar2 = (ostream *)std::ostream::operator<<(*(void **)this,sStack_28);
  std::operator<<(poVar2," total puts");
  poVar2 = std::operator<<(*(ostream **)this,"\nheterogeneous_queue: ");
  truncated_type_name<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
            (local_50,0x50);
  std::operator<<(poVar2,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  poVar2 = std::operator<<(*(ostream **)this,"\nruntime_type: ");
  truncated_type_name<density::runtime_type<>>(local_80,0x50);
  std::operator<<(poVar2,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  poVar2 = std::operator<<(*(ostream **)this,"\nallocator_type: ");
  truncated_type_name<density_tests::UnmovableFastTestAllocator<65536ul>>
            ((density_tests *)&objecty_leak_check,0x50);
  std::operator<<(poVar2,(string *)&objecty_leak_check);
  std::__cxx11::string::~string((string *)&objecty_leak_check);
  poVar2 = std::operator<<(*(ostream **)this,"\npage_alignment: ");
  std::ostream::operator<<(poVar2,0x10000);
  poVar2 = std::operator<<(*(ostream **)this,"\npage_size: ");
  std::ostream::operator<<(poVar2,0xfff0);
  poVar2 = std::operator<<(*(ostream **)this,"\nconc puts: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,false);
  poVar2 = std::operator<<(poVar2,"\t\t\tconc consume: ");
  std::ostream::operator<<(poVar2,false);
  poVar2 = std::operator<<(*(ostream **)this,"\nconc put-consumes: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
  poVar2 = std::operator<<(poVar2,"\t\t\tis_seq_cst: ");
  std::ostream::operator<<(poVar2,true);
  poVar2 = std::operator<<(*(ostream **)this,"\nwith_exceptions: ");
  std::ostream::operator<<(poVar2,(bool)(local_29 & 1));
  std::ostream::operator<<(*(void **)this,std::endl<char,std::char_traits<char>>);
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck(&local_a8);
  run_impl(in_stack_000008f8,in_stack_000008f4,in_stack_000008e8,in_stack_000008e0);
  poVar2 = std::operator<<(*(ostream **)this,"--------------------------------------------\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck(&local_a8);
  return;
}

Assistant:

void run(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            m_output << "starting queue generic test with " << m_thread_count << " threads and ";
            m_output << i_target_put_count << " total puts";
            m_output << "\nheterogeneous_queue: " << truncated_type_name<QUEUE>();
            m_output << "\nruntime_type: " << truncated_type_name<typename QUEUE::runtime_type>();
            m_output << "\nallocator_type: "
                     << truncated_type_name<typename QUEUE::allocator_type>();
            m_output << "\npage_alignment: " << QUEUE::allocator_type::page_alignment;
            m_output << "\npage_size: " << QUEUE::allocator_type::page_size;
            m_output << "\nconc puts: " << QUEUE::concurrent_puts
                     << "\t\t\tconc consume: " << QUEUE::concurrent_consumes;
            m_output << "\nconc put-consumes: " << QUEUE::concurrent_put_consumes
                     << "\t\t\tis_seq_cst: " << QUEUE::is_seq_cst;
            m_output << "\nwith_exceptions: " << with_exceptions;
            m_output << std::endl;

            InstanceCounted::ScopedLeakCheck objecty_leak_check;
            run_impl(i_flags, i_random, i_target_put_count);

            m_output << "--------------------------------------------\n" << std::endl;
        }